

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio_test.cc
# Opt level: O0

void basic_test(void)

{
  filemgr *key;
  int iVar1;
  filemgr_open_result fVar2;
  keylen_t keylen;
  filemgr_open_result result;
  char *fname;
  filemgr_config config;
  docio_object doc;
  char bodybuf [4096];
  char metabuf [1024];
  char keybuf [1024];
  filemgr *file;
  docio_handle handle;
  int blocksize;
  int r;
  uint32_t docsize;
  uint64_t offset;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined6 in_stack_ffffffffffffe690;
  ushort in_stack_ffffffffffffe696;
  undefined1 sync;
  undefined4 in_stack_ffffffffffffe6a4;
  char *doc_00;
  docio_handle *handle_00;
  undefined4 local_1950;
  undefined4 local_194c;
  undefined1 local_1940;
  undefined2 local_1930;
  undefined2 local_18f0;
  undefined2 local_18ee;
  undefined4 local_18ec;
  undefined1 *local_18d8;
  undefined1 *local_18c8;
  undefined1 *keybuf_00;
  keylen_t *in_stack_ffffffffffffe748;
  uint64_t in_stack_ffffffffffffe750;
  docio_handle *in_stack_ffffffffffffe758;
  err_log_callback *in_stack_ffffffffffffea48;
  filemgr_config *in_stack_ffffffffffffea50;
  filemgr_ops *in_stack_ffffffffffffea58;
  char *in_stack_ffffffffffffea60;
  err_log_callback *in_stack_ffffffffffffecd0;
  char *in_stack_ffffffffffffecd8;
  undefined1 in_stack_ffffffffffffece7;
  filemgr *in_stack_ffffffffffffece8;
  undefined1 local_8b8 [1024];
  undefined1 local_4b8 [1032];
  filemgr *local_b0;
  undefined8 local_78;
  undefined4 local_64;
  int local_60;
  uint local_5c;
  bid_t local_58;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_64 = 0x80;
  docio_object::docio_object
            ((docio_object *)CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690));
  doc_00 = "./docio_testfile";
  local_78 = 0;
  memset(local_4b8,0,0x400);
  memset(local_8b8,0,0x400);
  memset(&stack0xffffffffffffe748,0,0x1000);
  local_18d8 = local_4b8;
  local_18c8 = local_8b8;
  keybuf_00 = &stack0xffffffffffffe748;
  memset(&local_1950,0,0x60);
  local_1950 = local_64;
  local_194c = 0x400;
  local_1940 = 8;
  local_1930 = 8;
  local_60 = system("rm -rf  docio_testfile");
  handle_00 = (docio_handle *)doc_00;
  get_filemgr_ops();
  fVar2 = filemgr_open(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50
                       ,in_stack_ffffffffffffea48);
  key = fVar2.file;
  iVar1 = fVar2.rv;
  local_b0 = key;
  docio_init(handle_00,(filemgr *)CONCAT44(in_stack_ffffffffffffe6a4,iVar1),fVar2.file._7_1_);
  local_5c = _set_doc((docio_object *)CONCAT44(in_stack_ffffffffffffe6a4,iVar1),(char *)key,
                      (char *)CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),doc_00);
  local_58 = docio_append_doc((docio_handle *)
                              CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),
                              (docio_object *)doc_00,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)local_5c,local_58);
  local_5c = _set_doc((docio_object *)CONCAT44(in_stack_ffffffffffffe6a4,iVar1),(char *)key,
                      (char *)CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),doc_00);
  local_58 = docio_append_doc((docio_handle *)
                              CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),
                              (docio_object *)doc_00,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)local_5c,local_58);
  local_5c = _set_doc((docio_object *)CONCAT44(in_stack_ffffffffffffe6a4,iVar1),(char *)key,
                      (char *)CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),doc_00);
  local_58 = docio_append_doc((docio_handle *)
                              CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),
                              (docio_object *)doc_00,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)local_5c,local_58);
  local_5c = _set_doc((docio_object *)CONCAT44(in_stack_ffffffffffffe6a4,iVar1),(char *)key,
                      (char *)CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),doc_00);
  local_58 = docio_append_doc((docio_handle *)
                              CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),
                              (docio_object *)doc_00,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)local_5c,local_58);
  local_5c = _set_doc((docio_object *)CONCAT44(in_stack_ffffffffffffe6a4,iVar1),(char *)key,
                      (char *)CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),doc_00);
  sync = (undefined1)((ulong)key >> 0x38);
  local_58 = docio_append_doc((docio_handle *)
                              CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),
                              (docio_object *)doc_00,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)local_5c,local_58);
  local_18f0 = 1;
  local_18ee = 1;
  local_18ec = 0xbe;
  local_5c = 0xc2;
  local_58 = docio_append_doc((docio_handle *)
                              CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690),
                              (docio_object *)doc_00,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)local_5c,local_58);
  docio_read_doc_key(in_stack_ffffffffffffe758,in_stack_ffffffffffffe750,in_stack_ffffffffffffe748,
                     keybuf_00);
  printf("keylen %d %s\n",(ulong)in_stack_ffffffffffffe696,local_4b8);
  filemgr_commit((filemgr *)CONCAT44(in_stack_ffffffffffffe6a4,iVar1),(bool)sync,
                 (err_log_callback *)CONCAT26(in_stack_ffffffffffffe696,in_stack_ffffffffffffe690));
  filemgr_close(in_stack_ffffffffffffece8,(bool)in_stack_ffffffffffffece7,in_stack_ffffffffffffecd8,
                in_stack_ffffffffffffecd0);
  if (basic_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","basic test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","basic test");
  }
  return;
}

Assistant:

void basic_test()
{
    TEST_INIT();

    uint64_t offset;
    uint32_t docsize;
    int r;
    int blocksize = 128;
    struct docio_handle handle;
    struct filemgr *file;
    char keybuf[1024];
    char metabuf[1024];
    char bodybuf[4096];
    struct docio_object doc;
    struct filemgr_config config;
    char *fname = (char *) "./docio_testfile";

    handle.log_callback = NULL;

    memset(keybuf, 0x0, 1024);
    memset(metabuf, 0x0, 1024);
    memset(bodybuf, 0x0, 4096);
    doc.key = (void*)keybuf;
    doc.meta = (void*)metabuf;
    doc.body = (void*)bodybuf;

    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 1024;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;
    r = system(SHELL_DEL " docio_testfile");
    (void)r;
    filemgr_open_result result = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = result.file;
    docio_init(&handle, file, false);

    docsize = _set_doc(&doc, (char *) "this_is_key", (char *) "this_is_metadata",
                       (char *) "this_is_body_lawiefjaawleif");
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    docsize = _set_doc(&doc, (char *) "this_is_key2", (char *) "this_is_metadata2",
                       (char *) "hello_world");
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    docsize = _set_doc(&doc, (char *) "key3", (char *) "a", (char *) "b");
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    docsize = _set_doc(&doc, (char *) "key4", (char *) "a", (char *) "b");
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    docsize = _set_doc(&doc, (char *) "key5", (char *) "a", (char *) "b");
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    doc.length.keylen = 1;
    doc.length.metalen = 1;
    doc.length.bodylen = 190;
    docsize = 12 + 182;
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    keylen_t keylen;
    docio_read_doc_key(&handle, 81, &keylen, (void*)keybuf);
    DBG("keylen %d %s\n", keylen, keybuf);

    filemgr_commit(file, true, NULL);
    filemgr_close(file, true, NULL, NULL);

    TEST_RESULT("basic test");
}